

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

bool dxil_spv::emit_cmpxchg_instruction(Impl *impl,AtomicCmpXchgInst *instruction)

{
  uint width;
  Id IVar1;
  uint uVar2;
  Id IVar3;
  Builder *this;
  Type *pTVar4;
  Operation *this_00;
  Value *pVVar5;
  Operation *this_01;
  Operation *this_02;
  Id local_50;
  Id local_4c;
  Vector<spv::Id> local_48;
  
  this = Converter::Impl::builder(impl);
  pTVar4 = LLVMBC::Value::getType((Value *)instruction);
  pTVar4 = LLVMBC::Type::getStructElementType(pTVar4,0);
  width = LLVMBC::Type::getIntegerBitWidth(pTVar4);
  uVar2 = width;
  if (width == 0x40) {
    local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_48.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0xc);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this->capabilities,(Capability *)&local_48);
    uVar2 = 0x40;
  }
  IVar1 = spv::Builder::makeIntegerType(this,uVar2,false);
  this_00 = Converter::Impl::allocate(impl,OpAtomicCompareExchange,IVar1);
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getPointerOperand(instruction);
  if ((impl->shader_analysis).needs_auto_group_shared_barriers == true) {
    pTVar4 = LLVMBC::Value::getType(pVVar5);
    uVar2 = LLVMBC::Type::getPointerAddressSpace(pTVar4);
    if ((char)uVar2 == '\x03') {
      this_00->flags = this_00->flags | 4;
    }
  }
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getPointerOperand(instruction);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  Operation::add_id(this_00,IVar1);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,2,false);
  Operation::add_id(this_00,IVar1);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,0,false);
  Operation::add_id(this_00,IVar1);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,0,false);
  Operation::add_id(this_00,IVar1);
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getNewValOperand(instruction);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  Operation::add_id(this_00,IVar1);
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getCompareOperand(instruction);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  IVar1 = spv::Builder::makeBoolType(this);
  this_01 = Converter::Impl::allocate(impl,OpIEqual,IVar1);
  local_50 = this_00->id;
  pVVar5 = LLVMBC::AtomicCmpXchgInst::getCompareOperand(instruction);
  local_4c = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (Id *)0x2;
  local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = &local_50;
  Operation::add_ids(this_01,(initializer_list<unsigned_int> *)&local_48);
  Converter::Impl::add(impl,this_01,false);
  IVar1 = impl->cmpxchg_type;
  if (IVar1 == 0) {
    IVar1 = spv::Builder::makeIntegerType(this,width,false);
    IVar3 = spv::Builder::makeBoolType(this);
    local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
    local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 2;
    *local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar1;
    local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[1] = IVar3;
    local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    IVar1 = Converter::Impl::get_struct_type(impl,&local_48,0,"CmpXchgResult");
    impl->cmpxchg_type = IVar1;
    if (local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
      free_in_thread(local_48.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      IVar1 = impl->cmpxchg_type;
    }
  }
  this_02 = Converter::Impl::allocate(impl,OpCompositeConstruct,(Value *)instruction,IVar1);
  local_50 = this_00->id;
  local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = &local_50;
  local_4c = this_01->id;
  local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  Operation::add_ids(this_02,(initializer_list<unsigned_int> *)&local_48);
  Converter::Impl::add(impl,this_02,false);
  return true;
}

Assistant:

bool emit_cmpxchg_instruction(Converter::Impl &impl, const llvm::AtomicCmpXchgInst *instruction)
{
	auto &builder = impl.builder();

	unsigned bits = instruction->getType()->getStructElementType(0)->getIntegerBitWidth();
	if (bits == 64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	Operation *atomic_op = impl.allocate(spv::OpAtomicCompareExchange, builder.makeUintType(bits));
	if (needs_group_shared_auto_barrier(impl, instruction->getPointerOperand()))
		atomic_op->flags |= Operation::AutoGroupSharedBarrier;

	atomic_op->add_id(impl.get_id_for_value(instruction->getPointerOperand()));

	atomic_op->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));
	atomic_op->add_id(builder.makeUintConstant(0));
	atomic_op->add_id(builder.makeUintConstant(0));
	atomic_op->add_id(impl.get_id_for_value(instruction->getNewValOperand()));
	atomic_op->add_id(impl.get_id_for_value(instruction->getCompareOperand()));

	impl.add(atomic_op);

	Operation *cmp_op = impl.allocate(spv::OpIEqual, builder.makeBoolType());
	cmp_op->add_ids({ atomic_op->id, impl.get_id_for_value(instruction->getCompareOperand()) });
	impl.add(cmp_op);

	if (!impl.cmpxchg_type)
		impl.cmpxchg_type =
		    impl.get_struct_type({ builder.makeUintType(bits), builder.makeBoolType() }, 0, "CmpXchgResult");

	Operation *op = impl.allocate(spv::OpCompositeConstruct, instruction, impl.cmpxchg_type);
	op->add_ids({ atomic_op->id, cmp_op->id });
	impl.add(op);

	return true;
}